

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void ** __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
CreateEmptyTable(InnerMap *this,size_type n)

{
  void **ppvVar1;
  
  ppvVar1 = Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::Alloc<void*>
                      ((InnerMap *)this,n);
  ppvVar1 = (void **)memset(ppvVar1,0,n << 3);
  return ppvVar1;
}

Assistant:

void** CreateEmptyTable(size_type n) {
      GOOGLE_DCHECK(n >= kMinTableSize);
      GOOGLE_DCHECK_EQ(n & (n - 1), 0);
      void** result = Alloc<void*>(n);
      memset(result, 0, n * sizeof(result[0]));
      return result;
    }